

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O1

void __thiscall helics::CommsInterface::logError(CommsInterface *this,string_view message)

{
  ostream *poVar1;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((this->loggingCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::operator+(&local_48,"commERROR||",&this->name);
    __args_1._M_str = local_48._M_dataplus._M_p;
    __args_1._M_len = local_48._M_string_length;
    std::
    function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
    ::operator()(&this->loggingCallback,0,__args_1,message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"commERROR||",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,message._M_str,message._M_len);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void CommsInterface::logError(std::string_view message) const
{
    if (loggingCallback) {
        loggingCallback(HELICS_LOG_LEVEL_ERROR, "commERROR||" + name, message);
    } else {
        std::cerr << "commERROR||" << name << ":" << message << std::endl;
    }
}